

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::MessageSetFieldSkipper::SkipMessageSetField
          (MessageSetFieldSkipper *this,CodedInputStream *input,int field_number)

{
  CodedInputStream *this_00;
  bool bVar1;
  string *buffer;
  uint32_t local_28;
  int local_24;
  uint32_t length;
  int field_number_local;
  CodedInputStream *input_local;
  MessageSetFieldSkipper *this_local;
  
  local_24 = field_number;
  _length = input;
  input_local = (CodedInputStream *)this;
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_28);
  this_00 = _length;
  if (bVar1) {
    if ((this->super_UnknownFieldSetFieldSkipper).unknown_fields_ == (UnknownFieldSet *)0x0) {
      this_local._7_1_ = io::CodedInputStream::Skip(_length,local_28);
    }
    else {
      buffer = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                         ((this->super_UnknownFieldSetFieldSkipper).unknown_fields_,local_24);
      this_local._7_1_ = io::CodedInputStream::ReadString(this_00,buffer,local_28);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MessageSetFieldSkipper::SkipMessageSetField(io::CodedInputStream* input,
                                                 int field_number) {
  uint32_t length;
  if (!input->ReadVarint32(&length)) return false;
  if (unknown_fields_ == nullptr) {
    return input->Skip(length);
  } else {
    return input->ReadString(unknown_fields_->AddLengthDelimited(field_number),
                             length);
  }
}